

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::ArenaTest_RepeatedPtrFieldMoveCtorOnArena_Test::TestBody
          (ArenaTest_RepeatedPtrFieldMoveCtorOnArena_Test *this)

{
  RepeatedPtrFieldBase *this_00;
  TestAllTypes *message;
  void *ptr;
  RepeatedPtrFieldBase *this_01;
  uint64_t uVar1;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>_> *message_00;
  pointer *__ptr;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  char *pcVar3;
  AssertionResult gtest_ar;
  uint64_t usage_original;
  uint64_t usage_by_move;
  Arena arena;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e8;
  ThreadSafeArena *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  AssertHelper local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  AssertHelper local_c0;
  ThreadSafeArena local_b8;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_b8);
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       protobuf::internal::ThreadSafeArena::SpaceUsed(&local_b8);
  local_c0.data_ = (AssertHelperData *)((ulong)local_c0.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_e0,"arena.SpaceUsed()","0",(unsigned_long *)&local_c8,
             (int *)&local_c0);
  if (local_e0._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x1d5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    _Var2._M_head_impl = local_c8._M_head_impl;
  }
  else {
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
    this_00 = (RepeatedPtrFieldBase *)Arena::Allocate((Arena *)&local_b8,0x18);
    this_00->tagged_rep_or_elem_ = (void *)0x0;
    this_00->current_size_ = 0;
    this_00->capacity_proxy_ = 0;
    this_00->arena_ = (Arena *)&local_b8;
    message = (TestAllTypes *)
              protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                        (this_00,Arena::DefaultConstruct<proto2_unittest::TestAllTypes>);
    TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(message);
    TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(message);
    local_c8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         protobuf::internal::ThreadSafeArena::SpaceUsed(&local_b8);
    ptr = Arena::Allocate((Arena *)&local_b8,0x18);
    local_e0 = &local_b8;
    this_01 = &Arena::
               InternalHelper<google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes>>::
               Construct<google::protobuf::Arena*,google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes>>
                         (ptr,(Arena **)&local_e0,
                          (RepeatedPtrField<proto2_unittest::TestAllTypes> *)this_00)->
               super_RepeatedPtrFieldBase;
    uVar1 = protobuf::internal::ThreadSafeArena::SpaceUsed(&local_b8);
    local_c0.data_ = (AssertHelperData *)(uVar1 - (long)local_c8._M_head_impl);
    local_e8._M_head_impl._0_4_ = this_01->current_size_;
    local_d0.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_e0,"moved->size()","1",(int *)&local_e8,(int *)&local_d0);
    if (local_e0._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_e8);
      if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar3 = (local_d8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x1e1,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_e8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e8._M_head_impl + 8))();
      }
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
    message_00 = protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
                           (this_01,0);
    TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(message_00);
    local_e8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_e0,"usage_by_move","sizeof(internal::RepeatedPtrFieldBase)",
               (unsigned_long *)&local_c0,(unsigned_long *)&local_e8);
    if (local_e0._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_e8);
      if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar3 = (local_d8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x1e5,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_e8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e8._M_head_impl + 8))();
      }
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
    local_e8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (&local_c0.data_[0xe].message.field_2._M_allocated_capacity + 1);
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)&local_e0,"usage_by_move + sizeof(TestAllTypes)","usage_original",
               (unsigned_long *)&local_e8,(unsigned_long *)&local_c8);
    if (local_e0._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_e8);
      if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar3 = (local_d8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x1e6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_e8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e8._M_head_impl + 8))();
      }
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
    local_e8._M_head_impl._0_4_ = this_00->current_size_;
    local_d0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_e0,"original->size()","0",(int *)&local_e8,(int *)&local_d0);
    if (local_e0._0_1_ != (internal)0x0) goto LAB_00507cfb;
    testing::Message::Message((Message *)&local_e8);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x1ea,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    _Var2._M_head_impl = local_e8._M_head_impl;
  }
  if (_Var2._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)_Var2._M_head_impl + 8))();
  }
LAB_00507cfb:
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_b8);
  return;
}

Assistant:

TEST(ArenaTest, RepeatedPtrFieldMoveCtorOnArena) {
  Arena arena;

  ASSERT_EQ(arena.SpaceUsed(), 0);

  auto* original = Arena::Create<RepeatedPtrField<TestAllTypes>>(&arena);
  auto* msg = original->Add();
  TestUtil::SetAllFields(msg);
  TestUtil::ExpectAllFieldsSet(*msg);

  auto usage_original = arena.SpaceUsed();
  auto* moved = Arena::Create<RepeatedPtrField<TestAllTypes>>(
      &arena, std::move(*original));
  auto usage_by_move = arena.SpaceUsed() - usage_original;

  EXPECT_EQ(moved->size(), 1);
  TestUtil::ExpectAllFieldsSet(moved->Get(0));

  // The only extra allocation with moves is sizeof(RepeatedPtrField).
  EXPECT_EQ(usage_by_move, sizeof(internal::RepeatedPtrFieldBase));
  EXPECT_LT(usage_by_move + sizeof(TestAllTypes), usage_original);

  // Status after move is unspecified and must not be assumed. It's merely
  // checking current implementation specifics for protobuf internal.
  EXPECT_EQ(original->size(), 0);
}